

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::FillLikeLayerParams::FillLikeLayerParams
          (FillLikeLayerParams *this,FillLikeLayerParams *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FillLikeLayerParams_003ff5c0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->value_ = from->value_;
  return;
}

Assistant:

FillLikeLayerParams::FillLikeLayerParams(const FillLikeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  value_ = from.value_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FillLikeLayerParams)
}